

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXProperties.cpp
# Opt level: O3

Property * Assimp::FBX::anon_unknown_6::ReadTypedProperty(Element *element)

{
  _Alloc_hider __s1;
  int iVar1;
  _func_int **pp_Var2;
  Property *pPVar3;
  undefined **ppuVar4;
  Token *in_RDX;
  Token *t;
  float fVar5;
  float fVar6;
  float fVar7;
  string local_50;
  string local_30;
  
  ParseTokenAsString_abi_cxx11_
            (&local_30,
             (FBX *)(element->tokens).
                    super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                    ._M_impl.super__Vector_impl_data._M_start[1],in_RDX);
  __s1._M_p = local_30._M_dataplus._M_p;
  iVar1 = strcmp(local_30._M_dataplus._M_p,"KString");
  if (iVar1 == 0) {
    pPVar3 = (Property *)operator_new(0x28);
    ParseTokenAsString_abi_cxx11_
              (&local_50,
               (FBX *)(element->tokens).
                      super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                      ._M_impl.super__Vector_impl_data._M_start[4],t);
    pPVar3->_vptr_Property = (_func_int **)&PTR__TypedProperty_0025ca88;
    pPVar3[1]._vptr_Property = (_func_int **)(pPVar3 + 3);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(pPVar3 + 1),local_50._M_dataplus._M_p,
               local_50._M_dataplus._M_p + local_50._M_string_length);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p);
    }
  }
  else {
    iVar1 = strcmp(__s1._M_p,"bool");
    if (iVar1 != 0) {
      iVar1 = strcmp(__s1._M_p,"Bool");
      if (iVar1 != 0) {
        iVar1 = strcmp(__s1._M_p,"int");
        if (iVar1 != 0) {
          iVar1 = strcmp(__s1._M_p,"Int");
          if (iVar1 != 0) {
            iVar1 = strcmp(__s1._M_p,"enum");
            if (iVar1 != 0) {
              iVar1 = strcmp(__s1._M_p,"Enum");
              if (iVar1 != 0) {
                iVar1 = strcmp(__s1._M_p,"ULongLong");
                if (iVar1 == 0) {
                  pPVar3 = (Property *)operator_new(0x10);
                  pp_Var2 = (_func_int **)
                            ParseTokenAsID((element->tokens).
                                           super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                                           ._M_impl.super__Vector_impl_data._M_start[4]);
                  ppuVar4 = &PTR__Property_0025cae8;
                }
                else {
                  iVar1 = strcmp(__s1._M_p,"KTime");
                  if (iVar1 != 0) {
                    iVar1 = strcmp(__s1._M_p,"Vector3D");
                    if (iVar1 != 0) {
                      iVar1 = strcmp(__s1._M_p,"ColorRGB");
                      if (iVar1 != 0) {
                        iVar1 = strcmp(__s1._M_p,"Vector");
                        if (iVar1 != 0) {
                          iVar1 = strcmp(__s1._M_p,"Color");
                          if (iVar1 != 0) {
                            iVar1 = strcmp(__s1._M_p,"Lcl Translation");
                            if (iVar1 != 0) {
                              iVar1 = strcmp(__s1._M_p,"Lcl Rotation");
                              if (iVar1 != 0) {
                                iVar1 = strcmp(__s1._M_p,"Lcl Scaling");
                                if (iVar1 != 0) {
                                  iVar1 = strcmp(__s1._M_p,"double");
                                  if (iVar1 != 0) {
                                    iVar1 = strcmp(__s1._M_p,"Number");
                                    if (iVar1 != 0) {
                                      iVar1 = strcmp(__s1._M_p,"Float");
                                      if (iVar1 != 0) {
                                        iVar1 = strcmp(__s1._M_p,"FieldOfView");
                                        if (iVar1 != 0) {
                                          iVar1 = strcmp(__s1._M_p,"UnitScaleFactor");
                                          if (iVar1 != 0) {
                                            pPVar3 = (Property *)0x0;
                                            goto LAB_001873ab;
                                          }
                                        }
                                      }
                                    }
                                  }
                                  pPVar3 = (Property *)operator_new(0x10);
                                  fVar7 = ParseTokenAsFloat((element->tokens).
                                                                                                                        
                                                  super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                                                  ._M_impl.super__Vector_impl_data._M_start[4]);
                                  pPVar3->_vptr_Property = (_func_int **)&PTR__Property_0025cb48;
                                  *(float *)&pPVar3[1]._vptr_Property = fVar7;
                                  goto LAB_001873ab;
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                    pPVar3 = (Property *)operator_new(0x18);
                    fVar7 = ParseTokenAsFloat((element->tokens).
                                              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start[4]);
                    fVar5 = ParseTokenAsFloat((element->tokens).
                                              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start[5]);
                    fVar6 = ParseTokenAsFloat((element->tokens).
                                              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start[6]);
                    pPVar3->_vptr_Property = (_func_int **)&PTR__Property_0025cb28;
                    *(float *)&pPVar3[1]._vptr_Property = fVar7;
                    *(float *)((long)&pPVar3[1]._vptr_Property + 4) = fVar5;
                    *(float *)&pPVar3[2]._vptr_Property = fVar6;
                    goto LAB_001873ab;
                  }
                  pPVar3 = (Property *)operator_new(0x10);
                  pp_Var2 = (_func_int **)
                            ParseTokenAsInt64((element->tokens).
                                              super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                                              ._M_impl.super__Vector_impl_data._M_start[4]);
                  ppuVar4 = &PTR__Property_0025cb08;
                }
                pPVar3->_vptr_Property = (_func_int **)ppuVar4;
                pPVar3[1]._vptr_Property = pp_Var2;
                goto LAB_001873ab;
              }
            }
          }
        }
        pPVar3 = (Property *)operator_new(0x10);
        iVar1 = ParseTokenAsInt((element->tokens).
                                super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                                ._M_impl.super__Vector_impl_data._M_start[4]);
        pPVar3->_vptr_Property = (_func_int **)&PTR__Property_0025cac8;
        *(int *)&pPVar3[1]._vptr_Property = iVar1;
        goto LAB_001873ab;
      }
    }
    pPVar3 = (Property *)operator_new(0x10);
    iVar1 = ParseTokenAsInt((element->tokens).
                            super__Vector_base<const_Assimp::FBX::Token_*,_std::allocator<const_Assimp::FBX::Token_*>_>
                            ._M_impl.super__Vector_impl_data._M_start[4]);
    pPVar3->_vptr_Property = (_func_int **)&PTR__Property_0025caa8;
    *(bool *)&pPVar3[1]._vptr_Property = iVar1 != 0;
  }
LAB_001873ab:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p);
  }
  return pPVar3;
}

Assistant:

Property* ReadTypedProperty(const Element& element)
{
    ai_assert(element.KeyToken().StringContents() == "P");

    const TokenList& tok = element.Tokens();
    ai_assert(tok.size() >= 5);

    const std::string& s = ParseTokenAsString(*tok[1]);
    const char* const cs = s.c_str();
    if (!strcmp(cs,"KString")) {
        return new TypedProperty<std::string>(ParseTokenAsString(*tok[4]));
    }
    else if (!strcmp(cs,"bool") || !strcmp(cs,"Bool")) {
        return new TypedProperty<bool>(ParseTokenAsInt(*tok[4]) != 0);
    }
    else if (!strcmp(cs, "int") || !strcmp(cs, "Int") || !strcmp(cs, "enum") || !strcmp(cs, "Enum")) {
        return new TypedProperty<int>(ParseTokenAsInt(*tok[4]));
    }
    else if (!strcmp(cs, "ULongLong")) {
        return new TypedProperty<uint64_t>(ParseTokenAsID(*tok[4]));
    }
    else if (!strcmp(cs, "KTime")) {
        return new TypedProperty<int64_t>(ParseTokenAsInt64(*tok[4]));
    }
    else if (!strcmp(cs,"Vector3D") ||
        !strcmp(cs,"ColorRGB") ||
        !strcmp(cs,"Vector") ||
        !strcmp(cs,"Color") ||
        !strcmp(cs,"Lcl Translation") ||
        !strcmp(cs,"Lcl Rotation") ||
        !strcmp(cs,"Lcl Scaling")
        ) {
        return new TypedProperty<aiVector3D>(aiVector3D(
            ParseTokenAsFloat(*tok[4]),
            ParseTokenAsFloat(*tok[5]),
            ParseTokenAsFloat(*tok[6]))
        );
    }
    else if (!strcmp(cs,"double") || !strcmp(cs,"Number") || !strcmp(cs,"Float") || !strcmp(cs,"FieldOfView") || !strcmp( cs, "UnitScaleFactor" ) ) {
        return new TypedProperty<float>(ParseTokenAsFloat(*tok[4]));
    }
    return NULL;
}